

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnViewPrivate::~QColumnViewPrivate(QColumnViewPrivate *this)

{
  ~QColumnViewPrivate(this);
  operator_delete(this,0x5c0);
  return;
}

Assistant:

QColumnViewPrivate::~QColumnViewPrivate()
{
}